

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

void __thiscall mxx::comm::send<char,13ul>(comm *this,char (*msg) [13],int dest,int tag)

{
  int iVar1;
  MPI_Datatype poVar2;
  undefined1 local_38 [8];
  datatype dt;
  int tag_local;
  int dest_local;
  char (*msg_local) [13];
  comm *this_local;
  
  dt._16_4_ = tag;
  dt._20_4_ = dest;
  if (-1 < dest) {
    iVar1 = size(this);
    if (dest < iVar1) goto LAB_001eefec;
  }
  assert_fail("0 <= dest && dest < this->size()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
              ,0x134,"send");
LAB_001eefec:
  get_datatype<char>();
  poVar2 = mxx::datatype::type((datatype *)local_38);
  MPI_Send(msg,0xc,poVar2,dt._20_4_,dt._16_4_,this->mpi_comm);
  mxx::datatype::~datatype((datatype *)local_38);
  return;
}

Assistant:

inline void send(const CharT(&msg)[N], int dest, int tag = 0) const {
        MXX_ASSERT(0 <= dest && dest < this->size());
        if (N < mxx::max_int) {
            mxx::datatype dt = mxx::get_datatype<CharT>();
            MPI_Send(const_cast<CharT*>(msg), N-1, dt.type(), dest, tag, this->mpi_comm);
        } else {
            mxx::datatype dt = mxx::get_datatype<CharT>().contiguous(N-1);
            MPI_Send(const_cast<CharT*>(msg), 1, dt.type(), dest, tag, this->mpi_comm);
        }
    }